

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

bool __thiscall
QTreeModel::setHeaderData
          (QTreeModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((orientation == Horizontal && -1 < section) && (this->headerItem != (QTreeWidgetItem *)0x0)) {
    iVar3 = (**(code **)(*(long *)this + 0x80))(this);
    if (section < iVar3) {
      (*this->headerItem->_vptr_QTreeWidgetItem[4])
                (this->headerItem,(ulong)(uint)section,(ulong)(uint)role,value);
      bVar2 = true;
      goto LAB_0054db77;
    }
  }
  bVar2 = false;
LAB_0054db77:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeModel::setHeaderData(int section, Qt::Orientation orientation,
                               const QVariant &value, int role)
{
    if (section < 0 || orientation != Qt::Horizontal || !headerItem || section >= columnCount())
        return false;

    headerItem->setData(section, role, value);
    return true;
}